

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

String __thiscall Bstrlib::String::splitFrom(String *this,String *find,bool includeFind)

{
  int iVar1;
  int iVar2;
  byte in_CL;
  undefined7 in_register_00000011;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *puVar3;
  String SVar4;
  int size;
  int pos;
  bool includeFind_local;
  String *find_local;
  String *this_local;
  String *ret;
  
  iVar1 = Find(find,(String *)CONCAT71(in_register_00000011,includeFind),0);
  if (iVar1 == -1) {
    if ((in_CL & 1) == 0) {
      String(this);
      puVar3 = extraout_RDX_00;
    }
    else {
      String(this,find);
      operator=(find,"");
      puVar3 = extraout_RDX;
    }
  }
  else {
    iVar2 = getLength((String *)CONCAT71(in_register_00000011,includeFind));
    midString(this,(int)find,0);
    iVar1 = bdelete(&find->super_tagbstring,0,iVar1 + iVar2);
    puVar3 = extraout_RDX_01;
    if (iVar1 == -1) {
      fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
              "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
              ,0x5db,"Failure in remove");
      puVar3 = extraout_RDX_02;
    }
  }
  SVar4.super_tagbstring.data = puVar3;
  SVar4.super_tagbstring._0_8_ = this;
  return (String)SVar4.super_tagbstring;
}

Assistant:

const String String::splitFrom(const String & find, const bool includeFind)
    {
        int pos = Find(find, 0);
        if (pos == -1)
        {
            if (includeFind)
            {
                String ret(*this);
                *this = "";
                return ret;
            }
            return String();
        }
        int size = pos + find.getLength();
        String ret = midString(0, includeFind ? size : pos);
        if (BSTR_ERR == bdelete(this, 0, size)) bstringThrow("Failure in remove");
        return ret;
    }